

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

Clip Rml::ComputeClip(Property *property)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int value;
  Property *property_local;
  
  iVar3 = Property::Get<int>(property);
  if (property->unit == KEYWORD) {
    Style::Clip::Clip((Clip *)((long)&property_local + 7),(Type)iVar3,'\0');
  }
  else if (property->unit == NUMBER) {
    Style::Clip::Clip((Clip *)((long)&property_local + 7),Number,(Type)iVar3);
  }
  else {
    bVar2 = Assert("Invalid clip type",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                   ,0xa0);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    Style::Clip::Clip((Clip *)((long)&property_local + 7));
  }
  return (Clip)property_local._7_1_;
}

Assistant:

Style::Clip ComputeClip(const Property* property)
{
	const int value = property->Get<int>();
	if (property->unit == Unit::KEYWORD)
		return Style::Clip(static_cast<Style::Clip::Type>(value));
	else if (property->unit == Unit::NUMBER)
		return Style::Clip(Style::Clip::Type::Number, static_cast<int8_t>(value));
	RMLUI_ERRORMSG("Invalid clip type");
	return Style::Clip();
}